

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14PrivateEnums.cpp
# Opt level: O2

ENUM__fx_opaque_enum
COLLADASaxFWL14::toEnum_ENUM__fx_opaque_enum
          (ParserChar **buffer,ParserChar *bufferEnd,bool *failed,
          pair<unsigned_long,_COLLADASaxFWL14::ENUM__fx_opaque_enum> *enumMap,
          _func_StringHash_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *baseConversionFunc)

{
  StringHash SVar1;
  
  SVar1 = (*baseConversionFunc)(buffer,bufferEnd,failed);
  if (enumMap->first != SVar1) {
    if (enumMap[1].first != SVar1) {
      *failed = true;
      return ENUM__fx_opaque_enum__COUNT;
    }
    enumMap = enumMap + 1;
  }
  *failed = false;
  return enumMap->second;
}

Assistant:

ENUM__fx_opaque_enum toEnum_ENUM__fx_opaque_enum (
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed,
    const std::pair<StringHash, ENUM__fx_opaque_enum>* enumMap,
    StringHash (*baseConversionFunc)( const ParserChar**, const ParserChar*, bool& )
)
{
    return Utils::toEnum<ENUM__fx_opaque_enum, StringHash, ENUM__fx_opaque_enum__COUNT>(buffer, bufferEnd, failed, enumMap, baseConversionFunc);
}